

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

char * stripRegisterPrefix(char *RegName)

{
  char *RegName_local;
  
  switch(*RegName) {
  case 'c':
    if (RegName[1] == 'r') {
      return RegName + 2;
    }
  default:
    RegName_local = RegName;
    break;
  case 'f':
  case 'r':
  case 'v':
    if (RegName[1] == 's') {
      RegName_local = RegName + 2;
    }
    else {
      RegName_local = RegName + 1;
    }
  }
  return RegName_local;
}

Assistant:

static char *stripRegisterPrefix(char *RegName)
{
	switch (RegName[0]) {
		case 'r':
		case 'f':
		case 'v':
			if (RegName[1] == 's')
				return RegName + 2;
			return RegName + 1;
		case 'c':
			if (RegName[1] == 'r')
				return RegName + 2;
	}

	return RegName;
}